

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall ON_String::Duplicate(ON_String *this)

{
  int iVar1;
  ON_String *in_RSI;
  ON_String *this_local;
  ON_String *s;
  
  iVar1 = Length(in_RSI);
  if (iVar1 < 1) {
    ON_String(this,&EmptyString);
  }
  else {
    ON_String(this,in_RSI);
    CopyArray(this);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::Duplicate() const
{
  if (Length() <= 0)
    return ON_String::EmptyString;
  ON_String s = *this;
  s.CopyArray();
  return s;
}